

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O3

PointerType __thiscall
cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(iterator *this)

{
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar1;
  pointer pSVar2;
  ulong uVar3;
  ulong uVar4;
  
  pcVar1 = this->Tree;
  if (pcVar1 == (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0) {
    __assert_fail("this->Tree",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmLinkedTree.h"
                  ,0x43,
                  "PointerType cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->() const [T = cmStateDetail::SnapshotDataType]"
                 );
  }
  uVar4 = (long)(pcVar1->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pcVar1->UpPositions).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  pSVar2 = (pcVar1->Data).
           super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (uVar4 != ((long)(pcVar1->Data).
                      super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 4) *
               0x4ec4ec4ec4ec4ec5) {
    __assert_fail("this->Tree->UpPositions.size() == this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmLinkedTree.h"
                  ,0x44,
                  "PointerType cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->() const [T = cmStateDetail::SnapshotDataType]"
                 );
  }
  uVar3 = this->Position;
  if (uVar4 < uVar3) {
    __assert_fail("this->Position <= this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmLinkedTree.h"
                  ,0x45,
                  "PointerType cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->() const [T = cmStateDetail::SnapshotDataType]"
                 );
  }
  if (uVar3 != 0) {
    return pSVar2 + uVar3 + 0xffffffffffffffff;
  }
  __assert_fail("this->Position > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmLinkedTree.h"
                ,0x46,
                "PointerType cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->() const [T = cmStateDetail::SnapshotDataType]"
               );
}

Assistant:

PointerType operator->() const
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Position <= this->Tree->Data.size());
      assert(this->Position > 0);
      return this->Tree->GetPointer(this->Position - 1);
    }